

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O0

bool beast::chop(string *what,string *input)

{
  long lVar1;
  size_type ret;
  string *input_local;
  string *what_local;
  
  lVar1 = std::__cxx11::string::find((string *)input,(ulong)what);
  if (lVar1 == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)input,0);
  }
  return lVar1 == 0;
}

Assistant:

bool chop (std::string const& what, std::string& input)
{
    auto ret = input.find (what);

    if (ret != 0)
        return false;

    input.erase (0, what.size ());
    return true;
}